

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_frame_short(stb_vorbis *f,int num_c,short **buffer,int num_samples)

{
  int d_offset;
  int in_ECX;
  stb_vorbis *in_RDX;
  int in_ESI;
  int unaff_retaddr;
  int len;
  float **output;
  float **data;
  int in_stack_ffffffffffffffe0;
  
  data = (float **)0x0;
  d_offset = stb_vorbis_get_frame_float
                       (in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(float ***)0x0);
  if (in_ECX < d_offset) {
    d_offset = in_ECX;
  }
  if (d_offset != 0) {
    convert_samples_short
              (in_ESI,(short **)in_RDX,in_ECX,in_stack_ffffffffffffffe0,data,d_offset,unaff_retaddr)
    ;
  }
  return d_offset;
}

Assistant:

int stb_vorbis_get_frame_short(stb_vorbis *f, int num_c, short **buffer, int num_samples)
{
   float **output = NULL;
   int len = stb_vorbis_get_frame_float(f, NULL, &output);
   if (len > num_samples) len = num_samples;
   if (len)
      convert_samples_short(num_c, buffer, 0, f->channels, output, 0, len);
   return len;
}